

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prox.cpp
# Opt level: O2

void lts2::SoftThresholding(Mat *X1,Mat *X2,float threshold)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int y;
  long lVar4;
  float fVar5;
  
  lVar4 = 0;
  do {
    if (*(int *)(X1 + 8) <= lVar4) {
      return;
    }
    lVar2 = **(long **)(X2 + 0x48) * lVar4 + *(long *)(X2 + 0x10);
    lVar3 = **(long **)(X1 + 0x48) * lVar4 + *(long *)(X1 + 0x10);
    for (lVar1 = 0; (int)lVar1 < *(int *)(X1 + 0xc); lVar1 = lVar1 + 1) {
      fVar5 = hypotf(*(float *)(lVar3 + lVar1 * 4),*(float *)(lVar2 + lVar1 * 4));
      if (fVar5 < 1e-06) {
LAB_0011052c:
        *(undefined4 *)(lVar3 + lVar1 * 4) = 0;
        fVar5 = 0.0;
      }
      else {
        *(float *)(lVar3 + lVar1 * 4) = *(float *)(lVar3 + lVar1 * 4) / fVar5;
        *(float *)(lVar2 + lVar1 * 4) = *(float *)(lVar2 + lVar1 * 4) / fVar5;
        fVar5 = fVar5 - threshold;
        if (fVar5 <= 0.0) goto LAB_0011052c;
        *(float *)(lVar3 + lVar1 * 4) = *(float *)(lVar3 + lVar1 * 4) * fVar5;
        fVar5 = fVar5 * *(float *)(lVar2 + lVar1 * 4);
      }
      *(float *)(lVar2 + lVar1 * 4) = fVar5;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void lts2::SoftThresholding(cv::Mat &X1, cv::Mat &X2, float threshold)
{
  for (int y = 0; y < X1.rows; ++y)
  {
    float* p_x1 = X1.ptr<float>(y);
    float* p_x2 = X2.ptr<float>(y);
        
    for (int x = 0; x < X1.cols; ++x, ++p_x1, ++p_x2)
    {
      float absX = hypotf(*p_x1, *p_x2);
            
      if ( absX < 1e-6 )
      {
        *p_x1 = 0.0;
        *p_x2 = 0.0;
      }
      else 
      {
        *p_x1 /= absX;
        *p_x2 /= absX;

        absX -= threshold;
                
        if ( absX > 0.0 )
        {
          *p_x1 *= absX;
          *p_x2 *= absX;
        }
        else
        {
          *p_x1 = 0.0;
          *p_x2 = 0.0;
        }
      }
    }
  }
}